

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

size_t __thiscall ByteArray::append(ByteArray *this,ByteArray *other)

{
  byte *pbVar1;
  size_t sVar2;
  size_t __n;
  size_t sVar3;
  byte *__src;
  size_t otherSize;
  size_t oldSize;
  ByteArray *other_local;
  ByteArray *this_local;
  
  sVar2 = size(this);
  __n = size(other);
  sVar3 = size(this);
  grow(this,sVar3 + __n);
  pbVar1 = this->data_;
  sVar3 = this->size_;
  __src = data(other,0);
  memcpy(pbVar1 + sVar3,__src,__n);
  this->size_ = __n + this->size_;
  return sVar2;
}

Assistant:

size_t ByteArray::append(const ByteArray& other)
{
	size_t oldSize = size();
	size_t otherSize = other.size();
	grow(size()+otherSize);
	memcpy(&data_[size_],other.data(),otherSize);
	size_ += otherSize;
	return oldSize;
}